

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_chunk_warning(png_const_structrp png_ptr,png_const_charp warning_message)

{
  char local_f8 [8];
  char msg [214];
  png_const_charp warning_message_local;
  png_const_structrp png_ptr_local;
  
  if (png_ptr == (png_const_structrp)0x0) {
    png_warning((png_const_structrp)0x0,warning_message);
  }
  else {
    png_format_buffer(png_ptr,local_f8,warning_message);
    png_warning(png_ptr,local_f8);
  }
  return;
}

Assistant:

void PNGAPI
png_chunk_warning(png_const_structrp png_ptr, png_const_charp warning_message)
{
   char msg[18+PNG_MAX_ERROR_TEXT];
   if (png_ptr == NULL)
      png_warning(png_ptr, warning_message);

   else
   {
      png_format_buffer(png_ptr, msg, warning_message);
      png_warning(png_ptr, msg);
   }
}